

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeTree.h
# Opt level: O2

void __thiscall
TypeGenericAlias::TypeGenericAlias(TypeGenericAlias *this,InplaceStr name,SynIdentifier *baseName)

{
  TypeBase::TypeBase(&this->super_TypeBase,0xd,name);
  (this->super_TypeBase)._vptr_TypeBase = (_func_int **)&PTR__TypeBase_003e3270;
  this->baseName = baseName;
  if (baseName != (SynIdentifier *)0x0) {
    (this->super_TypeBase).isGeneric = true;
    return;
  }
  __assert_fail("baseName",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/TypeTree.h"
                ,0x3a5,"TypeGenericAlias::TypeGenericAlias(InplaceStr, SynIdentifier *)");
}

Assistant:

TypeGenericAlias(InplaceStr name, SynIdentifier *baseName): TypeBase(myTypeID, name), baseName(baseName)
	{
		assert(baseName);

		isGeneric = true;
	}